

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

void __thiscall
vkt::sr::ShaderRenderCaseInstance::checkSparseSupport
          (ShaderRenderCaseInstance *this,VkImageType imageType)

{
  InstanceInterface *vk;
  NotSupportedError *pNVar1;
  undefined1 local_104 [8];
  VkPhysicalDeviceFeatures deviceFeatures;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *instance;
  VkImageType imageType_local;
  ShaderRenderCaseInstance *this_local;
  
  vk = getInstanceInterface(this);
  deviceFeatures._212_8_ = getPhysicalDevice(this);
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)local_104,vk,(VkPhysicalDevice)deviceFeatures._212_8_);
  if (deviceFeatures.shaderInt64 == 0) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar1,"Required feature: shaderResourceResidency.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x574);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if (deviceFeatures.shaderResourceResidency == 0) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar1,"Required feature: sparseBinding.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x577);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((imageType == VK_IMAGE_TYPE_2D) && (deviceFeatures.sparseBinding == 0)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar1,"Required feature: sparseResidencyImage2D.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x57a);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  if ((imageType == VK_IMAGE_TYPE_3D) && (deviceFeatures.sparseResidencyBuffer == 0)) {
    pNVar1 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar1,"Required feature: sparseResidencyImage3D.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x57d);
    __cxa_throw(pNVar1,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  return;
}

Assistant:

void ShaderRenderCaseInstance::checkSparseSupport (const VkImageType imageType) const
{
	const InstanceInterface&		instance		= getInstanceInterface();
	const VkPhysicalDevice			physicalDevice	= getPhysicalDevice();
	const VkPhysicalDeviceFeatures	deviceFeatures	= getPhysicalDeviceFeatures(instance, physicalDevice);

	if (!deviceFeatures.shaderResourceResidency)
		TCU_THROW(NotSupportedError, "Required feature: shaderResourceResidency.");

	if (!deviceFeatures.sparseBinding)
		TCU_THROW(NotSupportedError, "Required feature: sparseBinding.");

	if (imageType == VK_IMAGE_TYPE_2D && !deviceFeatures.sparseResidencyImage2D)
		TCU_THROW(NotSupportedError, "Required feature: sparseResidencyImage2D.");

	if (imageType == VK_IMAGE_TYPE_3D && !deviceFeatures.sparseResidencyImage3D)
		TCU_THROW(NotSupportedError, "Required feature: sparseResidencyImage3D.");
}